

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O0

void Diligent::BasicFileSystem::GetPathComponents(String *Path,String *Directory,String *FileName)

{
  string local_68 [32];
  string local_48 [32];
  long local_28;
  size_type LastSlashPos;
  String *FileName_local;
  String *Directory_local;
  String *Path_local;
  
  LastSlashPos = (size_type)FileName;
  FileName_local = Directory;
  Directory_local = Path;
  local_28 = std::__cxx11::string::find_last_of((char *)Path,0xc073fa);
  if (FileName_local != (String *)0x0) {
    if (local_28 == -1) {
      std::__cxx11::string::operator=((string *)FileName_local,"");
    }
    else {
      std::__cxx11::string::substr((ulong)local_48,(ulong)Directory_local);
      std::__cxx11::string::operator=((string *)FileName_local,local_48);
      std::__cxx11::string::~string(local_48);
    }
  }
  if (LastSlashPos != 0) {
    if (local_28 == -1) {
      std::__cxx11::string::operator=((string *)LastSlashPos,(string *)Directory_local);
    }
    else {
      std::__cxx11::string::substr((ulong)local_68,(ulong)Directory_local);
      std::__cxx11::string::operator=((string *)LastSlashPos,local_68);
      std::__cxx11::string::~string(local_68);
    }
  }
  return;
}

Assistant:

void BasicFileSystem::GetPathComponents(const String& Path,
                                        String*       Directory,
                                        String*       FileName)
{
    auto LastSlashPos = Path.find_last_of("/\\");
    if (Directory)
    {
        if (LastSlashPos != String::npos)
            *Directory = Path.substr(0, LastSlashPos);
        else
            *Directory = "";
    }

    if (FileName)
    {
        if (LastSlashPos != String::npos)
            *FileName = Path.substr(LastSlashPos + 1);
        else
            *FileName = Path;
    }
}